

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

event_change *
event_changelist_get_or_construct
          (event_changelist *changelist,int fd,short old_events,event_changelist_fdinfo *fdinfo)

{
  int iVar1;
  event_change *peStack_30;
  int idx;
  event_change *change;
  event_changelist_fdinfo *fdinfo_local;
  short old_events_local;
  int fd_local;
  event_changelist *changelist_local;
  
  if (fdinfo->idxplus1 == 0) {
    if (changelist->changes_size < changelist->n_changes) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x34c,"changelist->n_changes <= changelist->changes_size",
                 "event_changelist_get_or_construct");
    }
    if ((changelist->n_changes == changelist->changes_size) &&
       (iVar1 = event_changelist_grow(changelist), iVar1 < 0)) {
      return (event_change *)0x0;
    }
    iVar1 = changelist->n_changes;
    changelist->n_changes = iVar1 + 1;
    peStack_30 = changelist->changes + iVar1;
    fdinfo->idxplus1 = iVar1 + 1;
    memset(peStack_30,0,0xc);
    peStack_30->fd = fd;
    peStack_30->old_events = old_events;
  }
  else {
    peStack_30 = changelist->changes + (fdinfo->idxplus1 + -1);
    if (peStack_30->fd != fd) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x35c,"change->fd == fd","event_changelist_get_or_construct");
    }
  }
  return peStack_30;
}

Assistant:

static struct event_change *
event_changelist_get_or_construct(struct event_changelist *changelist,
    evutil_socket_t fd,
    short old_events,
    struct event_changelist_fdinfo *fdinfo)
{
	struct event_change *change;

	if (fdinfo->idxplus1 == 0) {
		int idx;
		EVUTIL_ASSERT(changelist->n_changes <= changelist->changes_size);

		if (changelist->n_changes == changelist->changes_size) {
			if (event_changelist_grow(changelist) < 0)
				return NULL;
		}

		idx = changelist->n_changes++;
		change = &changelist->changes[idx];
		fdinfo->idxplus1 = idx + 1;

		memset(change, 0, sizeof(struct event_change));
		change->fd = fd;
		change->old_events = old_events;
	} else {
		change = &changelist->changes[fdinfo->idxplus1 - 1];
		EVUTIL_ASSERT(change->fd == fd);
	}
	return change;
}